

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

_Bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,ALLEGRO_TIMEOUT *timeout
                       )

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  uint idx;
  _Bool _Var4;
  byte bVar5;
  
  bVar5 = 0;
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  idx = queue->events_tail;
  _Var4 = true;
  if (queue->events_head == idx) {
    do {
      iVar1 = _al_cond_timedwait(&queue->cond,&queue->mutex,timeout);
      idx = queue->events_tail;
      _Var4 = iVar1 != -1;
      if (queue->events_head != idx) break;
    } while (iVar1 != -1);
  }
  if (_Var4 == true && ret_event != (ALLEGRO_EVENT *)0x0) {
    puVar2 = (undefined8 *)_al_vector_ref(&queue->events,idx);
    queue->events_tail = (uint)((ulong)(queue->events_tail + 1) % (queue->events)._size);
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)ret_event = *puVar2;
      puVar2 = puVar2 + (ulong)bVar5 * -2 + 1;
      ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar5 * -0x10 + 8);
    }
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  return _Var4;
}

Assistant:

static bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, ALLEGRO_TIMEOUT *timeout)
{
   bool timed_out = false;
   ALLEGRO_EVENT *next_event = NULL;

   _al_mutex_lock(&queue->mutex);
   {
      int result = 0;

      /* Is the queue is non-empty?  If not, block on a condition
       * variable, which will be signaled when an event is placed into
       * the queue.
       */
      while (is_event_queue_empty(queue) && (result != -1)) {
         result = _al_cond_timedwait(&queue->cond, &queue->mutex, timeout);
      }

      if (result == -1)
         timed_out = true;
      else if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);

   if (timed_out)
      return false;

   return true;
}